

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O3

bool anon_unknown.dwarf_2aea29d::FileHasArchitecture(char *filename,uint16_t machine)

{
  bool bVar1;
  uint16_t uVar2;
  cmELF elf;
  cmELF cStack_38;
  
  cmELF::cmELF(&cStack_38,filename);
  bVar1 = cmELF::Valid(&cStack_38);
  if (bVar1) {
    if (machine == 0) {
      bVar1 = true;
    }
    else {
      uVar2 = cmELF::GetMachine(&cStack_38);
      bVar1 = uVar2 == machine;
    }
  }
  else {
    bVar1 = false;
  }
  cmELF::~cmELF(&cStack_38);
  return bVar1;
}

Assistant:

bool FileHasArchitecture(const char* filename, std::uint16_t machine)
{
  cmELF elf(filename);
  if (!elf) {
    return false;
  }
  return machine == 0 || machine == elf.GetMachine();
}